

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int mmi_rand_train(model_inventory_t *inv,model_def_t *mdef,lexicon_t *lex,vector_t **f,
                  s3lattice_t *lat,float64 a_beam,uint32 mean_reest,uint32 var_reest,feat_t *fcb)

{
  uint32 uVar1;
  uint32 uVar2;
  s3arc_s *psVar3;
  lexicon_t *plVar4;
  model_inventory_t *pmVar5;
  int iVar6;
  int32 iVar7;
  time_t tVar8;
  acmod_id_t *r_phone;
  state_t *psVar9;
  vector_t **feature;
  acmod_id_t *paVar10;
  ulong uVar11;
  vector_t **pppfVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  uint32 n_state;
  float64 log_lik;
  char nword [128];
  char pword [128];
  char cword [128];
  uint32 local_21c;
  s3lattice_t *local_218;
  acmod_id_t *local_210;
  vector_t **local_208;
  acmod_id_t *local_200;
  lexicon_t *local_1f8;
  uint32 local_1ec;
  vector_t **local_1e8;
  model_inventory_t *local_1e0;
  model_def_t *local_1d8;
  float64 local_1d0;
  ulong local_1c8;
  float64 local_1c0;
  undefined4 local_1b8;
  undefined1 local_1b4;
  undefined4 local_138 [32];
  char local_b8 [136];
  
  local_21c = 0;
  local_1f8 = lex;
  local_1ec = mean_reest;
  local_1e0 = inv;
  local_1d8 = mdef;
  local_1d0 = a_beam;
  printf(" %5u",(ulong)lat->n_arcs);
  local_218 = lat;
  local_1e8 = f;
  if (lat->n_arcs != 0) {
    uVar15 = 0;
    do {
      pppfVar12 = local_1e8;
      iVar13 = lat->arc[uVar15].ef - lat->arc[uVar15].sf;
      local_1c8 = uVar15;
      local_208 = (vector_t **)
                  __ckd_calloc__((ulong)(iVar13 + 1),8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                                 ,0x45b);
      uVar14 = iVar13 + 1;
      local_210 = (acmod_id_t *)(ulong)uVar14;
      if (uVar14 != 0) {
        paVar10 = (acmod_id_t *)0x0;
        do {
          local_208[(long)paVar10] = pppfVar12[(lat->arc[uVar15].sf + (int)paVar10) - 1];
          paVar10 = (acmod_id_t *)((long)paVar10 + 1);
        } while (local_210 != paVar10);
      }
      uVar1 = lat->arc[uVar15].n_next_arcs;
      uVar2 = lat->arc[uVar15].n_prev_arcs;
      tVar8 = time((time_t *)0x0);
      srand((uint)tVar8);
      for (iVar13 = uVar1 * uVar2; iVar13 != 0; iVar13 = iVar13 + -1) {
        if (lat->arc[uVar15].good_arc != 0) break;
        if (lat->arc[uVar15].n_prev_arcs == 1) {
          uVar11 = 0;
        }
        else {
          iVar6 = rand();
          uVar11 = (long)((double)lat->arc[uVar15].n_prev_arcs *
                         (double)iVar6 * 4.656612873077393e-10) & 0xffffffff;
        }
        uVar14 = lat->arc[uVar15].prev_arcs[uVar11];
        if (lat->arc[uVar15].n_next_arcs == 1) {
          uVar11 = 0;
        }
        else {
          iVar6 = rand();
          uVar11 = (long)((double)lat->arc[uVar15].n_next_arcs *
                         (double)iVar6 * 4.656612873077393e-10) & 0xffffffff;
        }
        psVar3 = lat->arc;
        uVar1 = psVar3[uVar15].next_arcs[uVar11];
        strcpy(local_b8,psVar3[uVar15].word);
        local_200 = (acmod_id_t *)(ulong)uVar14;
        if (uVar14 == 0) {
          local_138[0] = 0x3e733c;
        }
        else {
          strcpy((char *)local_138,psVar3[uVar14 - 1].word);
        }
        paVar10 = mk_boundary_phone((char *)local_138,0,local_1f8);
        if (uVar1 == 0) {
          local_1b4 = 0;
          local_1b8 = 0x3e732f3c;
        }
        else {
          strcpy((char *)&local_1b8,local_218->arc[uVar1 - 1].word);
        }
        plVar4 = local_1f8;
        r_phone = mk_boundary_phone((char *)&local_1b8,1,local_1f8);
        pmVar5 = local_1e0;
        psVar9 = next_utt_states_mmie
                           (&local_21c,plVar4,local_1e0,local_1d8,local_b8,paVar10,r_phone);
        iVar7 = mmi_viterbi_run(&local_1c0,local_208,(uint32)local_210,psVar9,local_21c,pmVar5,
                                local_1d0);
        if (iVar7 == 0) {
          psVar3 = local_218->arc;
          psVar3[uVar15].good_arc = 1;
          psVar3[uVar15].ac_score = local_1c0;
          psVar3[uVar15].best_prev_arc = (uint32)local_200;
          psVar3[uVar15].best_next_arc = uVar1;
        }
        ckd_free(paVar10);
        ckd_free(r_phone);
        lat = local_218;
      }
      ckd_free(local_208);
      uVar11 = local_1c8;
      if (lat->arc[uVar15].good_arc == 0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                ,0x49e,"arc_%d is ignored (viterbi run failed)\n",(ulong)((int)local_1c8 + 1));
      }
      uVar15 = uVar11 + 1;
    } while (uVar15 < lat->n_arcs);
  }
  pppfVar12 = local_1e8;
  lat_fwd_bwd(lat);
  if (lat->n_arcs != 0) {
    uVar15 = 0;
    do {
      psVar3 = lat->arc;
      if (psVar3[uVar15].good_arc == 1) {
        iVar13 = psVar3[uVar15].ef - psVar3[uVar15].sf;
        feature = (vector_t **)
                  __ckd_calloc__((ulong)(iVar13 + 1),8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                                 ,0x4ad);
        uVar14 = iVar13 + 1;
        local_208 = (vector_t **)(ulong)uVar14;
        if (uVar14 != 0) {
          uVar11 = 0;
          do {
            feature[uVar11] = pppfVar12[(lat->arc[uVar15].sf + (int)uVar11) - 1];
            uVar11 = uVar11 + 1;
          } while (uVar14 != uVar11);
        }
        psVar3 = lat->arc;
        uVar1 = psVar3[uVar15].best_prev_arc;
        uVar2 = psVar3[uVar15].best_next_arc;
        strcpy(local_b8,psVar3[uVar15].word);
        if (uVar1 == 0) {
          local_138[0] = 0x3e733c;
        }
        else {
          strcpy((char *)local_138,psVar3[uVar1 - 1].word);
        }
        local_200 = mk_boundary_phone((char *)local_138,0,local_1f8);
        pppfVar12 = local_1e8;
        lat = local_218;
        if (uVar2 == 0) {
          local_1b4 = 0;
          local_1b8 = 0x3e732f3c;
        }
        else {
          strcpy((char *)&local_1b8,local_218->arc[uVar2 - 1].word);
        }
        plVar4 = local_1f8;
        local_210 = mk_boundary_phone((char *)&local_1b8,1,local_1f8);
        pmVar5 = local_1e0;
        psVar9 = next_utt_states_mmie
                           (&local_21c,plVar4,local_1e0,local_1d8,local_b8,local_200,local_210);
        iVar7 = mmi_viterbi_update(feature,(uint32)local_208,psVar9,local_21c,pmVar5,local_1d0,
                                   local_1ec,var_reest,lat->arc[uVar15].gamma,fcb);
        if (iVar7 != 0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                  ,0x4ce,"arc_%d is ignored (viterbi update failed)\n",(ulong)((int)uVar15 + 1));
        }
        ckd_free(feature);
        ckd_free(local_200);
        ckd_free(local_210);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < lat->n_arcs);
  }
  return 0;
}

Assistant:

int
mmi_rand_train(model_inventory_t *inv,
	       model_def_t *mdef,
	       lexicon_t *lex,
	       vector_t **f,
	       s3lattice_t *lat,
	       float64 a_beam,
	       uint32 mean_reest,
	       uint32 var_reest,
	       feat_t *fcb)
{
  uint32 k, n;
  uint32 n_rand;/* random number */
  uint32 n_max_run;/* the maximum number of viterbi run */
  char pword[128], cword[128], nword[128];      /* previous, current, next word */
  vector_t **arc_f = NULL;/* feature vector for a word arc */
  uint32 n_word_obs;/* frames of a word arc */
  uint32 rand_prev_id, rand_next_id;/* randomly selected previous and next arc id */
  uint32 *lphone, *rphone;        /* the last and first phone of previous and next word hypothesis */
  state_t *state_seq;/* HMM state sequence for an arc */
  uint32 n_state = 0;/* number of HMM states */
  float64 log_lik;/* log-likelihood of an arc */
  
  /* viterbi run on each arc */
  printf(" %5u", lat->n_arcs);
  
  for(n=0; n<lat->n_arcs; n++) {

    /* total observations of this arc */
    /* this is not very accurate, as it consumes one more frame for each word at the end */
    n_word_obs = lat->arc[n].ef - lat->arc[n].sf + 1;
    
    /* get the feature for this arc */
    arc_f = (vector_t **) ckd_calloc(n_word_obs, sizeof(vector_t *));
    for (k=0; k<n_word_obs; k++)
      arc_f[k] = f[k+lat->arc[n].sf-1];
    
    /* in case the viterbi run fails at a certain left and right context,
       at most randomly pick context n_prev_arcs * n_next_arcs times */
    n_max_run = lat->arc[n].n_prev_arcs * lat->arc[n].n_next_arcs;
    
    /* seed the random-number generator with current time */
    srand( (unsigned)time( NULL ) );
    
    /* randomly pick the left and right context */
    while (n_max_run > 0 && lat->arc[n].good_arc == 0) {
      
      /* get left arc id */
      if (lat->arc[n].n_prev_arcs == 1) {
	n_rand = 0;
      }
      else {
	n_rand = (uint32) (((double) rand() / (((double) RAND_MAX) + 1)) * lat->arc[n].n_prev_arcs );
      }
      rand_prev_id = lat->arc[n].prev_arcs[n_rand];

      /* get right arc id */
      if (lat->arc[n].n_next_arcs == 1) {
	n_rand = 0;
      }
      else {
	n_rand = (uint32) (((double) rand() / (((double) RAND_MAX) + 1)) * lat->arc[n].n_next_arcs );
      }
      rand_next_id = lat->arc[n].next_arcs[n_rand];
      
      /* get the triphone list */
      strcpy(cword, lat->arc[n].word);
      if (rand_prev_id == 0)
	strcpy(pword, "<s>");
      else
	strcpy(pword, lat->arc[rand_prev_id-1].word);
      lphone = mk_boundary_phone(pword, 0, lex);
      if (rand_next_id == 0)
	strcpy(nword, "</s>");
      else
	strcpy(nword, lat->arc[rand_next_id-1].word);
      rphone = mk_boundary_phone(nword, 1, lex);

      state_seq = next_utt_states_mmie(&n_state, lex, inv, mdef, cword, lphone, rphone);

      /* viterbi compuation to get the acoustic score for a word hypothesis */
      if (mmi_viterbi_run(&log_lik,
			  arc_f, n_word_obs,
			  state_seq, n_state,
			  inv,
			  a_beam) == S3_SUCCESS) {
	lat->arc[n].good_arc = 1;
	lat->arc[n].ac_score = log_lik;
	lat->arc[n].best_prev_arc = rand_prev_id;
	lat->arc[n].best_next_arc = rand_next_id;
      }

      n_max_run--;
      ckd_free(lphone);
      ckd_free(rphone);
    }
    
    ckd_free(arc_f);
    
    if (lat->arc[n].good_arc == 0) {
      E_INFO("arc_%d is ignored (viterbi run failed)\n", n+1);
    }
  }

  /* lattice-based forward-backward computation */
  lat_fwd_bwd(lat);

  /* update Gaussian parameters */
  for (n=0; n<lat->n_arcs; n++) {
    
    /* only if the arc was successful in viterbi run */
    if (lat->arc[n].good_arc == 1) {
      
      /* total observations of this arc */
      n_word_obs = lat->arc[n].ef - lat->arc[n].sf + 1;
      arc_f = (vector_t **) ckd_calloc(n_word_obs, sizeof(vector_t *));
      for (k=0; k<n_word_obs; k++)
	arc_f[k] = f[k+lat->arc[n].sf-1];
      
      /* get the randomly picked left and right context */
      rand_prev_id = lat->arc[n].best_prev_arc;
      rand_next_id = lat->arc[n].best_next_arc;
      
      /* get the triphone list */
      strcpy(cword, lat->arc[n].word);
      if (rand_prev_id == 0)
	strcpy(pword, "<s>");
      else
	strcpy(pword, lat->arc[rand_prev_id-1].word);
      lphone = mk_boundary_phone(pword, 0, lex);
      if (rand_next_id == 0)
	strcpy(nword, "</s>");
      else
	strcpy(nword, lat->arc[rand_next_id-1].word);
      rphone = mk_boundary_phone(nword, 1, lex);
      
      /* make state list */
      state_seq = next_utt_states_mmie(&n_state, lex, inv, mdef, cword, lphone, rphone);
      
      /* viterbi update model parameters */
      if (mmi_viterbi_update(arc_f, n_word_obs,
			     state_seq, n_state,
			     inv,
			     a_beam,
			     mean_reest,
			     var_reest,
			     lat->arc[n].gamma,
			     fcb) != S3_SUCCESS) {
	E_ERROR("arc_%d is ignored (viterbi update failed)\n", n+1);
      }
      ckd_free(arc_f);
      ckd_free(lphone);
      ckd_free(rphone);
    }
  }
  
  return S3_SUCCESS;
}